

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void delete_statement(Context_conflict *ctx,MOJOSHADER_astStatement *stmt)

{
  MOJOSHADER_astStatement *pMVar1;
  MOJOSHADER_astStatement *next;
  MOJOSHADER_astStatement *i;
  MOJOSHADER_astStatement *stmt_local;
  Context_conflict *ctx_local;
  
  if (stmt != (MOJOSHADER_astStatement *)0x0) {
    next = stmt->next;
    stmt->next = (MOJOSHADER_astStatement *)0x0;
    while (next != (MOJOSHADER_astStatement *)0x0) {
      pMVar1 = next->next;
      next->next = (MOJOSHADER_astStatement *)0x0;
      delete_statement(ctx,next);
      next = pMVar1;
    }
    switch((stmt->ast).type) {
    case MOJOSHADER_AST_STATEMENT_EMPTY:
      delete_empty_statement(ctx,stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_BREAK:
      delete_break_statement(ctx,stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_CONTINUE:
      delete_continue_statement(ctx,stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_DISCARD:
      delete_discard_statement(ctx,stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_BLOCK:
      delete_block_statement(ctx,(MOJOSHADER_astBlockStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_EXPRESSION:
      delete_expr_statement(ctx,(MOJOSHADER_astExpressionStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_IF:
      delete_if_statement(ctx,(MOJOSHADER_astIfStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_SWITCH:
      delete_switch_statement(ctx,(MOJOSHADER_astSwitchStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_FOR:
      delete_for_statement(ctx,(MOJOSHADER_astForStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_DO:
      delete_do_statement(ctx,(MOJOSHADER_astDoStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_WHILE:
      delete_while_statement(ctx,(MOJOSHADER_astWhileStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_RETURN:
      delete_return_statement(ctx,(MOJOSHADER_astReturnStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_TYPEDEF:
      delete_typedef_statement(ctx,(MOJOSHADER_astTypedefStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_STRUCT:
      delete_struct_statement(ctx,(MOJOSHADER_astStructStatement *)stmt);
      break;
    case MOJOSHADER_AST_STATEMENT_VARDECL:
      delete_vardecl_statement(ctx,(MOJOSHADER_astVarDeclStatement *)stmt);
      break;
    default:
      __assert_fail("0 && \"missing cleanup code\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x5eb,"void delete_statement(Context *, MOJOSHADER_astStatement *)");
    }
  }
  return;
}

Assistant:

static void delete_statement(Context *ctx, MOJOSHADER_astStatement *stmt)
{
    if (!stmt) return;

    // it's important to not recurse too deeply here, since you may have
    //  thousands of items in this linked list (each line of a massive
    //  function, for example). To avoid this, we iterate the list here,
    //  deleting all children and making them think they have no reason
    //  to recurse in their own delete methods.
    // Please note that everyone should _try_ to delete their "next" member,
    //  just in case, but hopefully this cleaned it out.

    MOJOSHADER_astStatement *i = stmt->next;
    stmt->next = NULL;
    while (i)
    {
        MOJOSHADER_astStatement *next = i->next;
        i->next = NULL;
        delete_statement(ctx, i);
        i = next;
    } // while

    switch (stmt->ast.type)
    {
        #define DELETE_STATEMENT(typ, cls, fn) \
            case MOJOSHADER_AST_STATEMENT_##typ: \
                delete_##fn##_statement(ctx, (cls *) stmt); break;
        DELETE_STATEMENT(BLOCK, MOJOSHADER_astBlockStatement, block);
        DELETE_STATEMENT(EMPTY, MOJOSHADER_astEmptyStatement, empty);
        DELETE_STATEMENT(IF, MOJOSHADER_astIfStatement, if);
        DELETE_STATEMENT(SWITCH, MOJOSHADER_astSwitchStatement, switch);
        DELETE_STATEMENT(EXPRESSION, MOJOSHADER_astExpressionStatement, expr);
        DELETE_STATEMENT(FOR, MOJOSHADER_astForStatement, for);
        DELETE_STATEMENT(DO, MOJOSHADER_astDoStatement, do);
        DELETE_STATEMENT(WHILE, MOJOSHADER_astWhileStatement, while);
        DELETE_STATEMENT(RETURN, MOJOSHADER_astReturnStatement, return);
        DELETE_STATEMENT(BREAK, MOJOSHADER_astBreakStatement, break);
        DELETE_STATEMENT(CONTINUE, MOJOSHADER_astContinueStatement, continue);
        DELETE_STATEMENT(DISCARD, MOJOSHADER_astDiscardStatement, discard);
        DELETE_STATEMENT(TYPEDEF, MOJOSHADER_astTypedefStatement, typedef);
        DELETE_STATEMENT(STRUCT, MOJOSHADER_astStructStatement, struct);
        DELETE_STATEMENT(VARDECL, MOJOSHADER_astVarDeclStatement, vardecl);
        #undef DELETE_STATEMENT
        default: assert(0 && "missing cleanup code"); break;
    } // switch
    // don't free (stmt) here, the class-specific functions do it.
}